

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void truncate<sparse_parameters>(vw *all,sparse_parameters *weights)

{
  int iVar1;
  
  if (truncate<sparse_parameters>(vw&,sparse_parameters&)::sd == '\0') {
    iVar1 = __cxa_guard_acquire(&truncate<sparse_parameters>(vw&,sparse_parameters&)::sd);
    if (iVar1 != 0) {
      truncate<sparse_parameters>::sd = calculate_sd<sparse_parameters>(all,weights);
      __cxa_guard_release(&truncate<sparse_parameters>(vw&,sparse_parameters&)::sd);
    }
  }
  iVar1 = 1 << ((byte)weights->_stride_shift & 0x1f);
  std::
  for_each<sparse_iterator<float>,truncate<sparse_parameters>(vw&,sparse_parameters&)::_lambda(float&)_1_>
            ((weights->_map)._M_h._M_before_begin._M_nxt,iVar1,0,iVar1);
  return;
}

Assistant:

void truncate(vw& all, T& weights)
{
  static double sd = calculate_sd(all, weights);
  for_each(weights.begin(), weights.end(), [](float& v) {
    if (abs(v) > sd * 2)
    {
      v = (float)std::remainder(v, sd * 2);
    }
  });
}